

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O0

void __thiscall
btIDebugDraw::drawSpherePatch
          (btIDebugDraw *this,btVector3 *center,btVector3 *up,btVector3 *axis,btScalar radius,
          btScalar minTh,btScalar maxTh,btScalar minPs,btScalar maxPs,btVector3 *color,
          btScalar stepDegrees,bool drawCenter)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  btVector3 *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  btScalar in_XMM0_Da;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  btVector3 bVar5;
  btScalar cps;
  btScalar sps;
  btScalar psi;
  int j;
  btScalar cth;
  btScalar sth;
  btScalar th;
  int i;
  btScalar step_v;
  int n_vert;
  bool isClosed;
  btScalar step_h;
  int n_hor;
  bool drawS;
  bool drawN;
  btVector3 jv;
  btVector3 *iv;
  btVector3 *kv;
  btScalar step;
  btVector3 arcStart;
  btVector3 spole;
  btVector3 npole;
  btVector3 *pT;
  btVector3 *pvB;
  btVector3 *pvA;
  btVector3 vB [74];
  btVector3 vA [74];
  btVector3 *pbVar6;
  btScalar bVar7;
  btScalar bVar8;
  btVector3 *v2;
  btVector3 *v;
  btVector3 *local_ae0;
  btVector3 *local_ac0;
  undefined8 local_a60;
  undefined8 local_a58;
  int local_a44;
  int local_a34;
  int local_a2c;
  int local_a20;
  bool local_a1a;
  bool local_a19;
  btVector3 local_9f0;
  btScalar local_9e0 [4];
  btScalar local_9d0 [4];
  btScalar local_9c0 [4];
  btScalar local_9b0 [4];
  btVector3 *local_9a0;
  btVector3 *local_998;
  btVector3 *local_990;
  btVector3 local_988 [74];
  btVector3 local_4e8 [74];
  btVector3 bStack_48;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  btVector3 local_24;
  btVector3 *local_10;
  
  bStack_48.m_floats[0]._3_1_ = in_R9B & 1;
  local_ac0 = local_4e8;
  bStack_48.m_floats[1] = in_XMM5_Da;
  bStack_48.m_floats._8_8_ = in_R8;
  local_34 = in_XMM4_Da;
  local_30 = in_XMM3_Da;
  local_2c = in_XMM2_Da;
  local_28 = in_XMM1_Da;
  local_24.m_floats[0] = in_XMM0_Da;
  local_10 = in_RSI;
  do {
    btVector3::btVector3(local_ac0);
    local_ac0 = local_ac0 + 1;
  } while (local_ac0 != &bStack_48);
  local_ae0 = local_988;
  do {
    btVector3::btVector3(local_ae0);
    local_ae0 = local_ae0 + 1;
  } while (local_ae0 != local_4e8);
  local_990 = local_4e8;
  local_998 = local_988;
  v = &local_24;
  v2 = local_10;
  local_9c0 = (btScalar  [4])::operator*(v,local_10->m_floats);
  local_9b0 = (btScalar  [4])operator+(v,v2);
  local_9e0 = (btScalar  [4])::operator*(v,v2->m_floats);
  local_9d0 = (btScalar  [4])operator-(v,v2);
  btVector3::btVector3(&local_9f0);
  fVar4 = bStack_48.m_floats[1] * 0.017453292;
  btVector3::cross(v,v2);
  fVar3 = local_30;
  fVar2 = local_34;
  local_a19 = local_28 <= -1.5707964;
  if (local_a19) {
    local_28 = fVar4 + -1.5707964;
  }
  bVar1 = 1.5707964 <= local_2c;
  if (bVar1) {
    local_2c = 1.5707964 - fVar4;
  }
  local_a1a = local_2c < local_28;
  if (local_a1a) {
    local_28 = fVar4 + -1.5707964;
    local_2c = 1.5707964 - fVar4;
  }
  local_a19 = local_a1a || local_a19;
  local_a1a = local_a1a || bVar1;
  local_a20 = (int)((local_2c - local_28) / fVar4) + 1;
  if (local_a20 < 2) {
    local_a20 = 2;
  }
  bVar1 = local_30 <= local_34;
  if (!bVar1) {
    local_30 = fVar4 + -3.1415927;
    local_34 = 3.1415927;
  }
  local_a2c = (int)((local_34 - local_30) / fVar4) + 1;
  if (local_a2c < 2) {
    local_a2c = 2;
  }
  for (local_a34 = 0; local_a34 < local_a20; local_a34 = local_a34 + 1) {
    bVar7 = local_24.m_floats[0];
    btSin(0.0);
    bVar8 = local_24.m_floats[0];
    btCos(0.0);
    for (local_a44 = 0; local_a44 < local_a2c; local_a44 = local_a44 + 1) {
      btSin(0.0);
      btCos(0.0);
      pbVar6 = local_10;
      ::operator*((btScalar *)CONCAT44(bVar8,bVar7),local_10);
      operator+(v,v2);
      ::operator*((btScalar *)CONCAT44(bVar8,bVar7),pbVar6);
      operator+(v,v2);
      ::operator*((btScalar *)CONCAT44(bVar8,bVar7),pbVar6);
      bVar5 = operator+(v,v2);
      local_a60 = bVar5.m_floats._0_8_;
      *(undefined8 *)local_998[local_a44].m_floats = local_a60;
      local_a58 = bVar5.m_floats._8_8_;
      *(undefined8 *)(local_998[local_a44].m_floats + 2) = local_a58;
      if (local_a34 == 0) {
        if (local_a1a) {
          (**(code **)(*in_RDI + 0x20))
                    (in_RDI,local_9d0,local_998 + local_a44,bStack_48.m_floats._8_8_);
        }
      }
      else {
        (**(code **)(*in_RDI + 0x20))
                  (in_RDI,local_990 + local_a44,local_998 + local_a44,bStack_48.m_floats._8_8_);
      }
      if (local_a44 == 0) {
        local_9f0.m_floats._0_8_ = *(undefined8 *)local_998->m_floats;
        local_9f0.m_floats._8_8_ = *(undefined8 *)(local_998->m_floats + 2);
      }
      else {
        (**(code **)(*in_RDI + 0x20))
                  (in_RDI,local_998 + (local_a44 + -1),local_998 + local_a44,
                   bStack_48.m_floats._8_8_);
      }
      if ((local_a34 == local_a20 + -1) && (local_a19)) {
        (**(code **)(*in_RDI + 0x20))
                  (in_RDI,local_9b0,local_998 + local_a44,bStack_48.m_floats._8_8_);
      }
      if ((bStack_48.m_floats[0]._3_1_ & 1) != 0) {
        if (bVar1 && fVar2 - fVar3 < 6.2831855) {
          if (((local_a34 == 0) || (local_a34 == local_a20 + -1)) &&
             ((local_a44 == 0 || (local_a44 == local_a2c + -1)))) {
            (**(code **)(*in_RDI + 0x20))
                      (in_RDI,local_10,local_998 + local_a44,bStack_48.m_floats._8_8_);
          }
        }
        else if (local_a44 == local_a2c + -1) {
          (**(code **)(*in_RDI + 0x20))
                    (in_RDI,&local_9f0,local_998 + local_a44,bStack_48.m_floats._8_8_);
        }
      }
    }
    local_9a0 = local_990;
    pbVar6 = local_998;
    local_998 = local_990;
    local_990 = pbVar6;
  }
  return;
}

Assistant:

virtual void drawSpherePatch(const btVector3& center, const btVector3& up, const btVector3& axis, btScalar radius, 
		btScalar minTh, btScalar maxTh, btScalar minPs, btScalar maxPs, const btVector3& color, btScalar stepDegrees = btScalar(10.f),bool drawCenter = true)
	{
		btVector3 vA[74];
		btVector3 vB[74];
		btVector3 *pvA = vA, *pvB = vB, *pT;
		btVector3 npole = center + up * radius;
		btVector3 spole = center - up * radius;
		btVector3 arcStart;
		btScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		const btVector3& kv = up;
		const btVector3& iv = axis;
		btVector3 jv = kv.cross(iv);
		bool drawN = false;
		bool drawS = false;
		if(minTh <= -SIMD_HALF_PI)
		{
			minTh = -SIMD_HALF_PI + step;
			drawN = true;
		}
		if(maxTh >= SIMD_HALF_PI)
		{
			maxTh = SIMD_HALF_PI - step;
			drawS = true;
		}
		if(minTh > maxTh)
		{
			minTh = -SIMD_HALF_PI + step;
			maxTh =  SIMD_HALF_PI - step;
			drawN = drawS = true;
		}
		int n_hor = (int)((maxTh - minTh) / step) + 1;
		if(n_hor < 2) n_hor = 2;
		btScalar step_h = (maxTh - minTh) / btScalar(n_hor - 1);
		bool isClosed = false;
		if(minPs > maxPs)
		{
			minPs = -SIMD_PI + step;
			maxPs =  SIMD_PI;
			isClosed = true;
		}
		else if((maxPs - minPs) >= SIMD_PI * btScalar(2.f))
		{
			isClosed = true;
		}
		else
		{
			isClosed = false;
		}
		int n_vert = (int)((maxPs - minPs) / step) + 1;
		if(n_vert < 2) n_vert = 2;
		btScalar step_v = (maxPs - minPs) / btScalar(n_vert - 1);
		for(int i = 0; i < n_hor; i++)
		{
			btScalar th = minTh + btScalar(i) * step_h;
			btScalar sth = radius * btSin(th);
			btScalar cth = radius * btCos(th);
			for(int j = 0; j < n_vert; j++)
			{
				btScalar psi = minPs + btScalar(j) * step_v;
				btScalar sps = btSin(psi);
				btScalar cps = btCos(psi);
				pvB[j] = center + cth * cps * iv + cth * sps * jv + sth * kv;
				if(i)
				{
					drawLine(pvA[j], pvB[j], color);
				}
				else if(drawS)
				{
					drawLine(spole, pvB[j], color);
				}
				if(j)
				{
					drawLine(pvB[j-1], pvB[j], color);
				}
				else
				{
					arcStart = pvB[j];
				}
				if((i == (n_hor - 1)) && drawN)
				{
					drawLine(npole, pvB[j], color);
				}
				
				if (drawCenter)
				{
					if(isClosed)
					{
						if(j == (n_vert-1))
						{
							drawLine(arcStart, pvB[j], color);
						}
					}
					else
					{
						if(((!i) || (i == (n_hor-1))) && ((!j) || (j == (n_vert-1))))
						{
							drawLine(center, pvB[j], color);
						}
					}
				}
			}
			pT = pvA; pvA = pvB; pvB = pT;
		}
	}